

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# run_3.h
# Opt level: O0

char * __thiscall search_5_3::index(search_5_3 *this,char *__s,int __c)

{
  bool bVar1;
  int *local_38;
  int *a;
  int local_28;
  int j;
  int i;
  int p_local;
  char *t_local;
  char *s_local;
  
  a._4_4_ = 1;
  next(__s,local_38);
  local_28 = __c;
  while( true ) {
    bVar1 = false;
    if (local_28 < (char)*this) {
      bVar1 = a._4_4_ < *__s;
    }
    if (!bVar1) break;
    if (this[local_28] == *(search_5_3 *)(__s + a._4_4_)) {
      local_28 = local_28 + 1;
      a._4_4_ = a._4_4_ + 1;
    }
    else {
      a._4_4_ = local_38[a._4_4_];
    }
  }
  if (*__s < a._4_4_) {
    s_local._4_4_ = local_28 - *__s;
  }
  else {
    s_local._4_4_ = 0;
  }
  return (char *)(ulong)s_local._4_4_;
}

Assistant:

int index(char *s, char *t, int p = 0) {
        int i = p, j = 1;
        int *a;
        next(t, a);
        while (i < s[0] && j < t[0]) {
            if (s[i] == t[j]) {
                i++, j++;
            } else {
                j = a[j];
            }
        }
        if (j > t[0])
            return i - t[0];
        return 0;
    }